

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O0

void png_write_sCAL_s(png_structrp png_ptr,int unit,png_const_charp width,png_const_charp height)

{
  size_t sVar1;
  size_t __n;
  ulong length;
  size_t total_len;
  size_t hlen;
  size_t wlen;
  png_byte buf [64];
  png_const_charp height_local;
  png_const_charp width_local;
  int unit_local;
  png_structrp png_ptr_local;
  
  buf._56_8_ = height;
  sVar1 = strlen(width);
  __n = strlen((char *)buf._56_8_);
  length = sVar1 + __n + 2;
  if (length < 0x41) {
    wlen._0_1_ = (undefined1)unit;
    memcpy((void *)((long)&wlen + 1),width,sVar1 + 1);
    memcpy(buf + (sVar1 - 6),(void *)buf._56_8_,__n);
    png_write_complete_chunk(png_ptr,0x7343414c,(png_const_bytep)&wlen,length);
  }
  else {
    png_warning(png_ptr,"Can\'t write sCAL (buffer too small)");
  }
  return;
}

Assistant:

void /* PRIVATE */
png_write_sCAL_s(png_structrp png_ptr, int unit, png_const_charp width,
    png_const_charp height)
{
   png_byte buf[64];
   size_t wlen, hlen, total_len;

   png_debug(1, "in png_write_sCAL_s");

   wlen = strlen(width);
   hlen = strlen(height);
   total_len = wlen + hlen + 2;

   if (total_len > 64)
   {
      png_warning(png_ptr, "Can't write sCAL (buffer too small)");
      return;
   }

   buf[0] = (png_byte)unit;
   memcpy(buf + 1, width, wlen + 1);      /* Append the '\0' here */
   memcpy(buf + wlen + 2, height, hlen);  /* Do NOT append the '\0' here */

   png_debug1(3, "sCAL total length = %u", (unsigned int)total_len);
   png_write_complete_chunk(png_ptr, png_sCAL, buf, total_len);
}